

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::javanano::PrimitiveOneofFieldGenerator::GenerateMembers
          (PrimitiveOneofFieldGenerator *this,Printer *printer,bool param_2)

{
  io::Printer::Print(printer,&this->variables_,
                     "public boolean has$capitalized_name$() {\n  return $has_oneof_case$;\n}\npublic $type$ get$capitalized_name$() {\n  if ($has_oneof_case$) {\n    return ($type$) ($boxed_type$) this.$oneof_name$_;\n  }\n  return $default$;\n}\npublic $message_name$ set$capitalized_name$($type$ value) {\n  $set_oneof_case$;\n  this.$oneof_name$_ = value;\n  return this;\n}\n"
                    );
  return;
}

Assistant:

void PrimitiveOneofFieldGenerator::GenerateMembers(
    io::Printer* printer, bool /*unused lazy_init*/) const {
  printer->Print(variables_,
    "public boolean has$capitalized_name$() {\n"
    "  return $has_oneof_case$;\n"
    "}\n"
    "public $type$ get$capitalized_name$() {\n"
    "  if ($has_oneof_case$) {\n"
    "    return ($type$) ($boxed_type$) this.$oneof_name$_;\n"
    "  }\n"
    "  return $default$;\n"
    "}\n"
    "public $message_name$ set$capitalized_name$($type$ value) {\n"
    "  $set_oneof_case$;\n"
    "  this.$oneof_name$_ = value;\n"
    "  return this;\n"
    "}\n");
}